

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgiwcs(fitsfile *fptr,char **header,int *status)

{
  int iVar1;
  int local_2c;
  int *piStack_28;
  int hdutype;
  int *status_local;
  char **header_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    piStack_28 = status;
    status_local = (int *)header;
    header_local = (char **)fptr;
    ffghdt(fptr,&local_2c,status);
    if (local_2c == 0) {
      iVar1 = ffh2st((fitsfile *)header_local,(char **)status_local,piStack_28);
      if (iVar1 < 1) {
        fptr_local._4_4_ = *piStack_28;
      }
      else {
        ffpmsg("error creating string of image WCS keywords (ffgiwcs)");
        fptr_local._4_4_ = *piStack_28;
      }
    }
    else {
      ffpmsg("Error in ffgiwcs. This HDU is not an image. Can\'t read WCS keywords");
      *piStack_28 = 0xe9;
      fptr_local._4_4_ = 0xe9;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgiwcs(fitsfile *fptr,  /* I - FITS file pointer                    */
           char **header,   /* O - pointer to the WCS related keywords  */
           int *status)     /* IO - error status                        */
/*
  int fits_get_image_wcs_keys 
  return a string containing all the image WCS header keywords.
  This string is then used as input to the wcsinit WCSlib routine.
  
  THIS ROUTINE IS DEPRECATED. USE fits_hdr2str INSTEAD
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    fits_get_hdu_type(fptr, &hdutype, status);
    if (hdutype != IMAGE_HDU)
    {
      ffpmsg(
     "Error in ffgiwcs. This HDU is not an image. Can't read WCS keywords");
      return(*status = NOT_IMAGE);
    }

    /* read header keywords into a long string of chars */
    if (ffh2st(fptr, header, status) > 0)
    {
        ffpmsg("error creating string of image WCS keywords (ffgiwcs)");
        return(*status);
    }

    return(*status);
}